

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslScanContext.cpp
# Opt level: O2

TBuiltInVariable __thiscall
glslang::HlslScanContext::mapSemantic(HlslScanContext *this,char *upperCase)

{
  key_type *__key;
  __node_ptr p_Var1;
  TBuiltInVariable TVar2;
  char *local_18;
  
  local_18 = upperCase;
  __key = (key_type *)
          anon_unknown.dwarf_10803b6::str_hash::operator()((str_hash *)upperCase,upperCase);
  TVar2 = EbvNone;
  p_Var1 = std::
           _Hashtable<const_char_*,_std::pair<const_char_*const,_glslang::TBuiltInVariable>,_std::allocator<std::pair<const_char_*const,_glslang::TBuiltInVariable>_>,_std::__detail::_Select1st,_(anonymous_namespace)::str_eq,_(anonymous_namespace)::str_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node((_Hashtable<const_char_*,_std::pair<const_char_*const,_glslang::TBuiltInVariable>,_std::allocator<std::pair<const_char_*const,_glslang::TBuiltInVariable>_>,_std::__detail::_Select1st,_(anonymous_namespace)::str_eq,_(anonymous_namespace)::str_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)((ulong)__key % DAT_00ade158),(size_type)&local_18,__key,
                          (__hash_code)__key);
  if (p_Var1 != (__node_ptr)0x0) {
    TVar2 = *(TBuiltInVariable *)
             ((long)&(p_Var1->
                     super__Hash_node_value<std::pair<const_char_*const,_glslang::TBuiltInVariable>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_char_*const,_glslang::TBuiltInVariable>_>
                     ._M_storage._M_storage + 8);
  }
  return TVar2;
}

Assistant:

glslang::TBuiltInVariable HlslScanContext::mapSemantic(const char* upperCase)
{
    auto it = SemanticMap.find(upperCase);
    if (it != SemanticMap.end())
        return it->second;
    else
        return glslang::EbvNone;
}